

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHPadding_Test::TestBody(SSLTest_ECHPadding_Test *this)

{
  internal iVar1;
  undefined8 uVar2;
  bool bVar3;
  SSL_METHOD *meth;
  long lVar4;
  pointer *__ptr_1;
  ScopedTrace *this_00;
  char *in_R8;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ScopedTrace gtest_trace_2251;
  ScopedTrace gtest_trace_2224;
  size_t client_hello_len_baseline2;
  size_t ech_len_baseline2;
  size_t client_hello_len;
  size_t ech_len;
  size_t client_hello_len_baseline;
  size_t ech_len_baseline;
  UniquePtr<SSL_CTX> ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  ScopedTrace local_81;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  undefined1 local_50 [8];
  undefined1 local_48 [16];
  AssertHelper local_38;
  
  meth = (SSL_METHOD *)TLS_method();
  local_48._8_8_ = SSL_CTX_new(meth);
  local_b8._M_head_impl._0_1_ = (internal)((SSL_CTX *)local_48._8_8_ != (SSL_CTX *)0x0);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((SSL_CTX *)local_48._8_8_ == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)&local_b8,(AssertionResult *)0x3442d9,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8a7,(char *)local_a8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
  }
  else {
    bVar3 = GetECHLength((SSL_CTX *)local_48._8_8_,(size_t *)local_50,(size_t *)local_48,0x345759,
                         in_R8);
    local_b8._M_head_impl._0_1_ = (internal)bVar3;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar3) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)&local_b8,
                 (AssertionResult *)
                 "GetECHLength(ctx.get(), &client_hello_len_baseline, &ech_len_baseline, 128, \"example.com\")"
                 ,"false","true",in_R9);
      in_R8 = (char *)local_a8;
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8ac,(char *)local_a8);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_a8 != (undefined1  [8])&local_98) {
        operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
      }
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      if (!bVar3) goto LAB_00169c0c;
    }
    lVar4 = 0;
    do {
      local_60._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (long)*(int *)((long)&DAT_003380f0 + lVar4);
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                ((ScopedTrace *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8b0,(unsigned_long *)&local_60);
      uVar2 = local_48._8_8_;
      local_a8 = (undefined1  [8])&local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)local_60._M_head_impl);
      bVar3 = GetECHLength((SSL_CTX *)uVar2,(size_t *)&local_58,(size_t *)&local_70,(size_t)local_a8
                           ,in_R8);
      local_b8._M_head_impl._0_1_ = (internal)bVar3;
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_a8 != (undefined1  [8])&local_98) {
        operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
      }
      iVar1 = local_b8._M_head_impl._0_1_;
      if (local_b8._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a8,(internal *)&local_b8,
                   (AssertionResult *)
                   "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, std::string(name_len, \'a\').c_str())"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8b3,(char *)local_a8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if (local_a8 != (undefined1  [8])&local_98) {
          operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
        }
        if (local_68.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_68.data_ + 8))();
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        this_00 = (ScopedTrace *)&local_80;
        goto LAB_00169c07;
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_a8,"client_hello_len","client_hello_len_baseline",
                 (unsigned_long *)&local_58,(unsigned_long *)local_50);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b8);
        pcVar5 = "";
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8b4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b8._M_head_impl + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      in_R8 = local_48;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_a8,"ech_len","ech_len_baseline",(unsigned_long *)&local_70,
                 (unsigned_long *)in_R8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b8);
        in_R8 = "";
        if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          in_R8 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8b5,in_R8);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b8._M_head_impl + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_80);
      if (iVar1 == (internal)0x0) goto LAB_00169c0c;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x18);
    bVar3 = GetECHLength((SSL_CTX *)local_48._8_8_,(size_t *)&local_60,(size_t *)&local_58,0,in_R8);
    local_b8._M_head_impl._0_1_ = (internal)bVar3;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar3) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)&local_b8,
                 (AssertionResult *)
                 "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, nullptr)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8bb,(char *)local_a8);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_a8 != (undefined1  [8])&local_98) {
        operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
      }
      if (local_70._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      if (!bVar3) goto LAB_00169c0c;
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_a8,"client_hello_len","client_hello_len_baseline",
               (unsigned_long *)&local_60,(unsigned_long *)local_50);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8bc,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if (local_b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b8._M_head_impl + 8))();
      }
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    pcVar5 = local_48;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_a8,"ech_len","ech_len_baseline",(unsigned_long *)&local_58,
               (unsigned_long *)pcVar5);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x8bd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
      if (local_b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b8._M_head_impl + 8))();
      }
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    uVar2 = local_48._8_8_;
    local_a8 = (undefined1  [8])&local_98;
    std::__cxx11::string::_M_construct((ulong)local_a8,-0x60);
    bVar3 = GetECHLength((SSL_CTX *)uVar2,(size_t *)&local_70,(size_t *)&local_68,(size_t)local_a8,
                         pcVar5);
    local_b8._M_head_impl._0_1_ = (internal)bVar3;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_b8._M_head_impl._0_1_ != (internal)0x0) {
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      local_b8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_48._0_8_ + 0x20);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_a8,"ech_len_baseline2","ech_len_baseline + 32",
                 (unsigned_long *)&local_68,(unsigned_long *)&local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b8);
        if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8c5,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if (local_b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b8._M_head_impl + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      pcVar5 = local_50;
      testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                ((internal *)local_a8,"client_hello_len_baseline2","client_hello_len_baseline",
                 (unsigned_long *)&local_70,(unsigned_long *)pcVar5);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b8);
        if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (local_a0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8c8,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if (local_b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b8._M_head_impl + 8))();
        }
      }
      if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,local_a0);
      }
      local_78._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x81;
      do {
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&local_81,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x8cb,(unsigned_long *)&local_78);
        uVar2 = local_48._8_8_;
        local_a8 = (undefined1  [8])&local_98;
        std::__cxx11::string::_M_construct((ulong)local_a8,(char)local_78._M_head_impl);
        bVar3 = GetECHLength((SSL_CTX *)uVar2,(size_t *)&local_60,(size_t *)&local_58,
                             (size_t)local_a8,pcVar5);
        local_b8._M_head_impl._0_1_ = (internal)bVar3;
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_a8 != (undefined1  [8])&local_98) {
          operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
        }
        iVar1 = local_b8._M_head_impl._0_1_;
        if (local_b8._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a8,(internal *)&local_b8,
                     (AssertionResult *)
                     "GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, std::string(name_len, \'a\').c_str())"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8cd,(char *)local_a8);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_a8 != (undefined1  [8])&local_98) {
            operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
          }
          if (local_80.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
          if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b0,local_b0);
          }
          this_00 = &local_81;
LAB_00169c07:
          testing::ScopedTrace::~ScopedTrace(this_00);
          break;
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        local_b8._M_head_impl._0_1_ =
             (internal)
             (local_58.data_ == local_68.data_ ||
             local_58.data_ == (AssertHelperData *)local_48._0_8_);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_58.data_ != local_68.data_ && local_58.data_ != (AssertHelperData *)local_48._0_8_
           ) {
          testing::Message::Message((Message *)&local_80);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_80.data_)->line);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a8,(internal *)&local_b8,
                     (AssertionResult *)
                     "ech_len == ech_len_baseline || ech_len == ech_len_baseline2","false","true",
                     in_R9);
          pcVar5 = (char *)local_a8;
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8ce,(char *)local_a8);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_a8 != (undefined1  [8])&local_98) {
            operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
          }
          if (local_80.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        local_b8._M_head_impl._0_1_ =
             (internal)
             (local_60._M_head_impl == local_70._M_head_impl ||
             (undefined1  [8])local_60._M_head_impl == local_50);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_60._M_head_impl != local_70._M_head_impl &&
            (undefined1  [8])local_60._M_head_impl != local_50) {
          testing::Message::Message((Message *)&local_80);
          std::ostream::_M_insert<unsigned_long>((ulong)&(local_80.data_)->line);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a8,(internal *)&local_b8,
                     (AssertionResult *)
                     "client_hello_len == client_hello_len_baseline || client_hello_len == client_hello_len_baseline2"
                     ,"false","true",in_R9);
          pcVar5 = (char *)local_a8;
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x8d1,(char *)local_a8);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (local_a8 != (undefined1  [8])&local_98) {
            operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
          }
          if (local_80.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        testing::ScopedTrace::~ScopedTrace(&local_81);
      } while ((iVar1 != (internal)0x0) &&
              (local_78._M_head_impl = local_78._M_head_impl + 1,
              local_78._M_head_impl <
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa0));
      goto LAB_00169c0c;
    }
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "GetECHLength(ctx.get(), &client_hello_len_baseline2, &ech_len_baseline2, 128, std::string(128 + 32, \'a\').c_str())"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x8c4,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    local_50 = (undefined1  [8])local_78._M_head_impl;
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
      local_50 = (undefined1  [8])local_78._M_head_impl;
    }
  }
  if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_50 !=
      (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
LAB_00169c0c:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(local_48 + 8));
  return;
}

Assistant:

TEST(SSLTest, ECHPadding) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Sample lengths with max_name_len = 128 as baseline.
  size_t client_hello_len_baseline, ech_len_baseline;
  ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len_baseline,
                           &ech_len_baseline, 128, "example.com"));

  // Check that all name lengths under the server's maximum look the same.
  for (size_t name_len : {1, 2, 32, 64, 127, 128}) {
    SCOPED_TRACE(name_len);
    size_t client_hello_len, ech_len;
    ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128,
                             std::string(name_len, 'a').c_str()));
    EXPECT_EQ(client_hello_len, client_hello_len_baseline);
    EXPECT_EQ(ech_len, ech_len_baseline);
  }

  // When sending no SNI, we must still pad as if we are sending one.
  size_t client_hello_len, ech_len;
  ASSERT_TRUE(
      GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128, nullptr));
  EXPECT_EQ(client_hello_len, client_hello_len_baseline);
  EXPECT_EQ(ech_len, ech_len_baseline);

  // Name lengths above the maximum do not get named-based padding, but the
  // overall input is padded to a multiple of 32.
  size_t client_hello_len_baseline2, ech_len_baseline2;
  ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len_baseline2,
                           &ech_len_baseline2, 128,
                           std::string(128 + 32, 'a').c_str()));
  EXPECT_EQ(ech_len_baseline2, ech_len_baseline + 32);
  // The ClientHello lengths may match if we are still under the threshold for
  // padding extension.
  EXPECT_GE(client_hello_len_baseline2, client_hello_len_baseline);

  for (size_t name_len = 128 + 1; name_len < 128 + 32; name_len++) {
    SCOPED_TRACE(name_len);
    ASSERT_TRUE(GetECHLength(ctx.get(), &client_hello_len, &ech_len, 128,
                             std::string(name_len, 'a').c_str()));
    EXPECT_TRUE(ech_len == ech_len_baseline || ech_len == ech_len_baseline2)
        << ech_len;
    EXPECT_TRUE(client_hello_len == client_hello_len_baseline ||
                client_hello_len == client_hello_len_baseline2)
        << client_hello_len;
  }
}